

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglplatformcontext.cpp
# Opt level: O2

void __thiscall
QEGLPlatformContext::swapBuffers(QEGLPlatformContext *this,QPlatformSurface *surface)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  long in_FS_OFFSET;
  char local_38 [24];
  char *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  eglBindAPI(this->m_api);
  iVar1 = (*(this->super_QPlatformOpenGLContext)._vptr_QPlatformOpenGLContext[0x11])(this,surface);
  if (CONCAT44(extraout_var,iVar1) != 0) {
    iVar1 = eglSwapBuffers(this->m_eglDisplay,CONCAT44(extraout_var,iVar1));
    if (iVar1 == 0) {
      local_38[0] = '\x02';
      local_38[1] = '\0';
      local_38[2] = '\0';
      local_38[3] = '\0';
      local_38[0x14] = '\0';
      local_38[0x15] = '\0';
      local_38[0x16] = '\0';
      local_38[0x17] = '\0';
      local_38[4] = '\0';
      local_38[5] = '\0';
      local_38[6] = '\0';
      local_38[7] = '\0';
      local_38[8] = '\0';
      local_38[9] = '\0';
      local_38[10] = '\0';
      local_38[0xb] = '\0';
      local_38[0xc] = '\0';
      local_38[0xd] = '\0';
      local_38[0xe] = '\0';
      local_38[0xf] = '\0';
      local_38[0x10] = '\0';
      local_38[0x11] = '\0';
      local_38[0x12] = '\0';
      local_38[0x13] = '\0';
      local_20 = "default";
      uVar2 = eglGetError();
      QMessageLogger::warning
                (local_38,"QEGLPlatformContext: eglSwapBuffers failed: %x",(ulong)uVar2);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QEGLPlatformContext::swapBuffers(QPlatformSurface *surface)
{
    eglBindAPI(m_api);
    EGLSurface eglSurface = eglSurfaceForPlatformSurface(surface);
    if (eglSurface != EGL_NO_SURFACE) { // skip if using surfaceless context
        bool ok = eglSwapBuffers(m_eglDisplay, eglSurface);
        if (!ok)
            qWarning("QEGLPlatformContext: eglSwapBuffers failed: %x", eglGetError());
    }
}